

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::MessageDifferencerTest_RepeatedFieldSet_RecursivePerformance_Test
::~MessageDifferencerTest_RepeatedFieldSet_RecursivePerformance_Test
          (MessageDifferencerTest_RepeatedFieldSet_RecursivePerformance_Test *this)

{
  MessageDifferencerTest_RepeatedFieldSet_RecursivePerformance_Test *this_local;
  
  ~MessageDifferencerTest_RepeatedFieldSet_RecursivePerformance_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(MessageDifferencerTest, RepeatedFieldSet_RecursivePerformance) {
  constexpr int kDepth = 20;

  proto2_unittest::TestField left;
  proto2_unittest::TestField* p = &left;
  for (int i = 0; i < kDepth; ++i) {
    p = p->add_rm();
  }

  proto2_unittest::TestField right = left;
  util::MessageDifferencer differencer;
  differencer.set_repeated_field_comparison(
      util::MessageDifferencer::RepeatedFieldComparison::AS_SET);
  CountingComparator comparator;
  differencer.set_field_comparator(&comparator);
  std::string report;
  differencer.ReportDifferencesToString(&report);
  differencer.Compare(left, right);

  EXPECT_LE(comparator.compare_count(), kDepth * kDepth);
}